

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

ThisType * __thiscall
Gs::Matrix<float,_3UL,_3UL>::operator*=(Matrix<float,_3UL,_3UL> *this,ThisType *rhs)

{
  Matrix<float,_3UL,_3UL> local_34;
  
  Gs::operator*(&local_34,this,rhs);
  operator=(this,&local_34);
  return this;
}

Assistant:

ThisType& operator *= (const ThisType& rhs)
        {
            GS_ASSERT_NxN_MATRIX;
            *this = (*this * rhs);
            return *this;
        }